

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O0

uint * __thiscall
HashTable<unsigned_int,_Memory::JitArenaAllocator>::FindOrInsert
          (HashTable<unsigned_int,_Memory::JitArenaAllocator> *this,uint element,int value)

{
  code *pcVar1;
  bool bVar2;
  Type *pTVar3;
  undefined4 *puVar4;
  Bucket<unsigned_int> *newBucket;
  Bucket<unsigned_int> *bucket;
  EditingIterator iter;
  uint depth;
  uint hash;
  int value_local;
  uint element_local;
  HashTable<unsigned_int,_Memory::JitArenaAllocator> *this_local;
  
  iter.last._4_4_ = Hash(this,value);
  iter.last._0_4_ = 1;
  SListBase<Bucket<unsigned_int>,_Memory::ArenaAllocator,_RealCount>::GetEditingIterator
            ((EditingIterator *)&bucket,this->table + iter.last._4_4_);
  do {
    bVar2 = SListBase<Bucket<unsigned_int>,_Memory::ArenaAllocator,_RealCount>::EditingIterator::
            Next((EditingIterator *)&bucket);
    if (!bVar2) {
LAB_00559967:
      pTVar3 = SListBase<Bucket<unsigned_int>,_Memory::ArenaAllocator,_RealCount>::EditingIterator::
               InsertNodeBefore((EditingIterator *)&bucket,&this->alloc->super_ArenaAllocator);
      if (pTVar3 == (Type *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/HashTable.h"
                           ,0x99,"(newBucket != nullptr)","newBucket != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      pTVar3->value = value;
      pTVar3->element = element;
      if (this->stats != (DictionaryStats *)0x0) {
        DictionaryStats::Insert(this->stats,(uint)iter.last);
      }
      return (uint *)0x0;
    }
    pTVar3 = SListBase<Bucket<unsigned_int>,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                       ((Iterator *)&bucket);
    if (pTVar3->value <= value) {
      if (pTVar3->value == value) {
        return &pTVar3->element;
      }
      goto LAB_00559967;
    }
    iter.last._0_4_ = (uint)iter.last + 1;
  } while( true );
}

Assistant:

T * FindOrInsert(T element, int value)
    {
        uint hash = this->Hash(value);

#if PROFILE_DICTIONARY
        uint depth = 1;
#endif
        // Keep sorted
        FOREACH_SLISTBASE_ENTRY_EDITING(Bucket<T>, bucket, &this->table[hash], iter)
        {
            if (bucket.value <= value)
            {
                if (bucket.value == value)
                {
                    return &(bucket.element);
                }
                break;
            }
#if PROFILE_DICTIONARY
            ++depth;
#endif
        } NEXT_SLISTBASE_ENTRY_EDITING;

        Bucket<T> * newBucket = iter.InsertNodeBefore(this->alloc);
        Assert(newBucket != nullptr);
        newBucket->value = value;
        newBucket->element = element;
#if PROFILE_DICTIONARY
        if (stats)
            stats->Insert(depth);
#endif
        return nullptr;
    }